

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QWidget ** __thiscall
QMap<Qt::GestureType,_QWidget_*>::operator[]
          (QMap<Qt::GestureType,_QWidget_*> *this,GestureType *key)

{
  bool bVar1;
  QMapData<std::map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>_>
  *pQVar2;
  pointer ppVar3;
  GestureType *in_RSI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_Qt::GestureType,_QWidget_*>_>,_bool> pVar4;
  iterator i;
  QMap<Qt::GestureType,_QWidget_*> copy;
  map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>
  *in_stack_ffffffffffffff78;
  QWidget **ppQVar5;
  QMap<Qt::GestureType,_QWidget_*> *in_stack_ffffffffffffff80;
  value_type *__x;
  pair<const_Qt::GestureType,_QWidget_*> *this_00;
  QWidget *local_48;
  pair<const_Qt::GestureType,_QWidget_*> local_40;
  _Self local_30;
  _Self local_28;
  undefined1 *local_20;
  _Base_ptr local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>_>_>
          ::isShared(&in_stack_ffffffffffffff80->d);
  if (bVar1) {
    QMap(in_stack_ffffffffffffff80,(QMap<Qt::GestureType,_QWidget_*> *)in_stack_ffffffffffffff78);
  }
  else {
    memset(&local_20,0,8);
    QMap((QMap<Qt::GestureType,_QWidget_*> *)0x2da413);
  }
  detach(in_stack_ffffffffffffff80);
  local_28._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>_>_>
                *)0x2da433);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>
       ::find(in_stack_ffffffffffffff78,(key_type *)0x2da444);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>_>_>
                *)0x2da453);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>
       ::end(in_stack_ffffffffffffff78);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    pQVar2 = QtPrivate::
             QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>_>_>
             ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>_>_>
                           *)0x2da483);
    __x = (value_type *)&pQVar2->m;
    local_48 = (QWidget *)0x0;
    this_00 = &local_40;
    std::pair<const_Qt::GestureType,_QWidget_*>::pair<QWidget_*,_true>(this_00,in_RSI,&local_48);
    pVar4 = std::
            map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>
            ::insert((map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>
                      *)this_00,__x);
    local_28._M_node = (_Base_ptr)pVar4.first._M_node;
    local_10 = pVar4.second;
    local_18 = local_28._M_node;
  }
  ppVar3 = std::_Rb_tree_iterator<std::pair<const_Qt::GestureType,_QWidget_*>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_Qt::GestureType,_QWidget_*>_> *)0x2da4ec);
  ppQVar5 = &ppVar3->second;
  ~QMap((QMap<Qt::GestureType,_QWidget_*> *)0x2da4fe);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return ppQVar5;
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }